

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,
               VkPipelineViewportDepthClampControlCreateInfoEXT *info,
               DynamicStateInfo *dynamic_state)

{
  DynamicStateInfo *dynamic_state_local;
  VkPipelineViewportDepthClampControlCreateInfoEXT *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  if ((dynamic_state == (DynamicStateInfo *)0x0) || ((dynamic_state->depth_clamp_range & 1U) == 0))
  {
    Hasher::u32(h,info->depthClampMode);
    if ((info->depthClampMode == VK_DEPTH_CLAMP_MODE_USER_DEFINED_RANGE_EXT) &&
       (info->pDepthClampRange != (VkDepthClampRangeEXT *)0x0)) {
      Hasher::f32(h,info->pDepthClampRange->minDepthClamp);
      Hasher::f32(h,info->pDepthClampRange->maxDepthClamp);
    }
    else {
      Hasher::u32(h,0);
    }
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *, Hasher &h,
                              const VkPipelineViewportDepthClampControlCreateInfoEXT &info,
							  const DynamicStateInfo *dynamic_state)
{
	if (dynamic_state && dynamic_state->depth_clamp_range)
		return;

	h.u32(info.depthClampMode);
	if (info.depthClampMode == VK_DEPTH_CLAMP_MODE_USER_DEFINED_RANGE_EXT && info.pDepthClampRange)
	{
		h.f32(info.pDepthClampRange->minDepthClamp);
		h.f32(info.pDepthClampRange->maxDepthClamp);
	}
	else
		h.u32(0);
}